

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool __thiscall xla::GraphCycles::CanContractEdge(GraphCycles *this,int32_t a,int32_t b)

{
  bool bVar1;
  bool reachable;
  int32_t b_local;
  int32_t a_local;
  GraphCycles *this_local;
  
  bVar1 = HasEdge(this,a,b);
  if (!bVar1) {
    __assert_fail("HasEdge(a, b) && \"No edge exists from a to b\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/xla/graphcycles.cc"
                  ,0x1b2,"bool xla::GraphCycles::CanContractEdge(int32_t, int32_t)");
  }
  RemoveEdge(this,a,b);
  bVar1 = IsReachableNonConst(this,a,b);
  InsertEdge(this,a,b);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool GraphCycles::CanContractEdge(int32_t a, int32_t b) {
  assert(HasEdge(a, b) && "No edge exists from a to b");
  RemoveEdge(a, b);
  bool reachable = IsReachableNonConst(a, b);
  // Restore the graph to its original state.
  InsertEdge(a, b);
  // If reachable, then contracting edge will cause cycle.
  return !reachable;
}